

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::ExecuteTask(WindowDistinctAggregatorLocalState *this)

{
  atomic<unsigned_long> *paVar1;
  PartitionSortStage PVar2;
  type state;
  reference this_00;
  type pLVar3;
  MergeSorter merge_sorter;
  undefined1 auStack_58 [24];
  _Head_base<0UL,_duckdb::SBScanState_*,_false> local_40;
  _Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_> local_38;
  _Head_base<0UL,_duckdb::SortedBlock_*,_false> local_30;
  __uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_> local_28;
  
  state = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
          operator*(&this->gastate->global_sort);
  PVar2 = this->stage;
  if (PVar2 == SORTED) {
    Sorted(this);
  }
  else if (PVar2 == MERGE) {
    MergeSorter::MergeSorter((MergeSorter *)auStack_58,state,state->buffer_manager);
    MergeSorter::PerformInMergeRound((MergeSorter *)auStack_58);
    if ((_Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>)
        local_28._M_t.
        super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>.
        super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl != (SortedBlock *)0x0) {
      ::std::default_delete<duckdb::SortedBlock>::operator()
                ((default_delete<duckdb::SortedBlock> *)&local_28,
                 (SortedBlock *)
                 local_28._M_t.
                 super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                 .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl);
    }
    local_28._M_t.
    super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>.
    super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl =
         (tuple<duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>)0x0;
    if ((_Head_base<0UL,_duckdb::SortedBlock_*,_false>)local_30._M_head_impl !=
        (_Head_base<0UL,_duckdb::SortedBlock_*,_false>)0x0) {
      ::std::default_delete<duckdb::SortedBlock>::operator()
                ((default_delete<duckdb::SortedBlock> *)&local_30,local_30._M_head_impl);
    }
    local_30._M_head_impl = (SortedBlock *)0x0;
    if (local_38.super__Head_base<0UL,_duckdb::SBScanState_*,_false>._M_head_impl !=
        (SBScanState *)0x0) {
      ::std::default_delete<duckdb::SBScanState>::operator()
                ((default_delete<duckdb::SBScanState> *)&local_38,
                 (SBScanState *)
                 local_38.super__Head_base<0UL,_duckdb::SBScanState_*,_false>._M_head_impl);
    }
    local_38.super__Head_base<0UL,_duckdb::SBScanState_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::SBScanState_*,_false>)(SBScanState *)0x0;
    if (local_40._M_head_impl != (SBScanState *)0x0) {
      ::std::default_delete<duckdb::SBScanState>::operator()
                ((default_delete<duckdb::SBScanState> *)&local_40,local_40._M_head_impl);
    }
  }
  else if (PVar2 == SCAN) {
    this_00 = vector<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_true>
              ::operator[](&this->gastate->local_sorts,this->block_idx);
    pLVar3 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>::
             operator*(this_00);
    GlobalSortState::AddLocalState(state,pLVar3);
  }
  LOCK();
  paVar1 = &this->gastate->tasks_completed;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void WindowDistinctAggregatorLocalState::ExecuteTask() {
	auto &global_sort = *gastate.global_sort;
	switch (stage) {
	case PartitionSortStage::SCAN:
		global_sort.AddLocalState(*gastate.local_sorts[block_idx]);
		break;
	case PartitionSortStage::MERGE: {
		MergeSorter merge_sorter(global_sort, global_sort.buffer_manager);
		merge_sorter.PerformInMergeRound();
		break;
	}
	case PartitionSortStage::SORTED:
		Sorted();
		break;
	default:
		break;
	}

	++gastate.tasks_completed;
}